

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O2

void __thiscall sc_core::sc_vector_base::context_scope::~context_scope(context_scope *this)

{
  sc_object *psVar1;
  
  if (this->owner_ != (sc_vector_base *)0x0) {
    psVar1 = sc_object_manager::hierarchy_pop
                       (((this->owner_->super_sc_object).m_simc)->m_object_manager);
    if (psVar1 != (this->owner_->super_sc_object).m_parent) {
      sc_assertion_failed("obj == owner_->get_parent_object()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/utils/sc_vector.cpp"
                          ,0x9b);
    }
  }
  return;
}

Assistant:

sc_vector_base::context_scope::~context_scope()
{
  if (owner_) // restore current object context
  {
    sc_object* obj = owner_->simcontext()->get_object_manager()->hierarchy_pop();
    sc_assert( obj == owner_->get_parent_object() );
  }
}